

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O3

void __thiscall GslSpan_RbeginRend_Test::TestBody(GslSpan_RbeginRend_Test *this)

{
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var2;
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var3;
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var4;
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var5;
  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar6;
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var7;
  reference ptVar8;
  reference lhs;
  pointer *__ptr;
  char *pcVar9;
  AssertionResult gtest_ar;
  iterator __end1;
  reverse_iterator beyond;
  reverse_iterator it;
  reverse_iterator first;
  span<int,__1L> s;
  int a [4];
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_b8;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_98;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_88;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_78;
  Message local_68;
  AssertHelper local_60;
  span<int,__1L> local_58;
  undefined1 *local_48;
  undefined8 uStack_40;
  
  local_58.storage_.data_ = (pointer)&local_48;
  local_48 = &DAT_200000001;
  uStack_40 = 0x400000003;
  local_58.storage_.super_extent_type<_1L>.size_ = 4;
  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8,&local_58,4);
  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_88,(span<int,__1L> *)local_c8,(index_type)local_c0);
  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_78,local_88.span_,local_88.index_);
  testing::internal::
  CmpHelperEQ<std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>,std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>>
            ((internal *)local_c8,"it","first",
             (reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
              *)&local_88,
             (reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
              *)&local_78);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar9 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x438,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  ptVar8 = std::
           reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>_>
           ::operator*((reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                        *)&local_88);
  local_b8.span_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>((internal *)local_c8,"*it","4",ptVar8,(int *)&local_b8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar9 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x439,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8,&local_58,0);
  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_98,(span<int,__1L> *)local_c8,(index_type)local_c0);
  testing::internal::
  CmpHelperNE<std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>,std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>>
            ((internal *)local_c8,"it","beyond",
             (reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
              *)&local_88,
             (reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
              *)&local_98);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = anon_var_dwarf_d372b + 0x50;
    }
    else {
      pcVar9 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x43c,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8,local_78.span_,
             local_78.index_);
  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_b8,local_98.span_,local_98.index_);
  uVar1._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = local_b8.span_._4_4_;
  uVar1._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_b8.span_._0_4_;
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_c8 ==
      (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )uVar1._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl) {
    local_c8 = (undefined1  [8])((long)local_c0 - local_b8.index_);
    local_b8.span_._0_4_ = 4;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)local_a8,"beyond - first","4",(long *)local_c8,(int *)&local_b8);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_c8);
      if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = anon_var_dwarf_d372b + 0x50;
      }
      else {
        pcVar9 = (local_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x43e,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
              ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8,local_78.span_,
               local_78.index_);
    pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
              (&local_b8,local_78.span_,local_78.index_);
    _Var2.
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = local_b8.span_._4_4_;
    _Var2.
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = local_b8.span_._0_4_;
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_c8 ==
        _Var2.
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl) {
      local_c8 = (undefined1  [8])((long)local_c0 - local_b8.index_);
      local_b8.span_._0_4_ = 0;
      testing::internal::CmpHelperEQ<long,int>
                ((internal *)local_a8,"first - first","0",(long *)local_c8,(int *)&local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_c8);
        if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = anon_var_dwarf_d372b + 0x50;
        }
        else {
          pcVar9 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                   ,0x43f,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
        if (local_c8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c8 + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8,local_98.span_,
                 local_98.index_);
      pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                (&local_b8,local_98.span_,local_98.index_);
      _Var3.
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = local_b8.span_._4_4_;
      _Var3.
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = local_b8.span_._0_4_;
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_c8 ==
          _Var3.
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl) {
        local_c8 = (undefined1  [8])((long)local_c0 - local_b8.index_);
        local_b8.span_._0_4_ = 0;
        testing::internal::CmpHelperEQ<long,int>
                  ((internal *)local_a8,"beyond - beyond","0",(long *)local_c8,(int *)&local_b8);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c8);
          if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = anon_var_dwarf_d372b + 0x50;
          }
          else {
            pcVar9 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                     ,0x440,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          if (local_c8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_c8 + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator--
                  (&local_88);
        pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                  ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8,local_78.span_,
                   local_78.index_);
        pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                  (&local_b8,local_88.span_,local_88.index_);
        _Var4.
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = local_b8.span_._4_4_;
        _Var4.
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = local_b8.span_._0_4_;
        if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )local_c8 ==
            _Var4.
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl) {
          local_c8 = (undefined1  [8])((long)local_c0 - local_b8.index_);
          local_b8.span_._0_4_ = 1;
          testing::internal::CmpHelperEQ<long,int>
                    ((internal *)local_a8,"it - first","1",(long *)local_c8,(int *)&local_b8);
          if (local_a8[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_c8);
            if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar9 = anon_var_dwarf_d372b + 0x50;
            }
            else {
              pcVar9 = (local_a0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                       ,0x443,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_b8,(Message *)local_c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
            if (local_c8 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_c8 + 8))();
            }
          }
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_a0,local_a0);
          }
          ptVar8 = std::
                   reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>_>
                   ::operator*((reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                                *)&local_88);
          local_b8.span_._0_4_ = 3;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_c8,"*it","3",ptVar8,(int *)&local_b8);
          if (local_c8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_b8);
            if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar9 = anon_var_dwarf_d372b + 0x50;
            }
            else {
              pcVar9 = (local_c0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                       ,0x444,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_a8,(Message *)&local_b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
            if ((long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) + 8))();
            }
          }
          if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c0,local_c0);
          }
          ptVar8 = std::
                   reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>_>
                   ::operator*((reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                                *)&local_88);
          *ptVar8 = 0x16;
          ptVar8 = std::
                   reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>_>
                   ::operator*((reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                                *)&local_88);
          local_b8.span_._0_4_ = 0x16;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_c8,"*it","22",ptVar8,(int *)&local_b8);
          if (local_c8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_b8);
            if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar9 = anon_var_dwarf_d372b + 0x50;
            }
            else {
              pcVar9 = (local_c0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                       ,0x446,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_a8,(Message *)&local_b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
            if ((long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) + 8))();
            }
          }
          if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c0,local_c0);
          }
          pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                    ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8,local_88.span_,
                     local_88.index_);
          pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                    (&local_b8,local_98.span_,local_98.index_);
          _Var5.
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = local_b8.span_._4_4_;
          _Var5.
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = local_b8.span_._0_4_;
          if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )local_c8 ==
              _Var5.
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl) {
            local_c8 = (undefined1  [8])((long)local_c0 - local_b8.index_);
            local_b8.span_._0_4_ = 3;
            testing::internal::CmpHelperEQ<long,int>
                      ((internal *)local_a8,"beyond - it","3",(long *)local_c8,(int *)&local_b8);
            if (local_a8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_c8);
              if (local_a0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = anon_var_dwarf_d372b + 0x50;
              }
              else {
                pcVar9 = (local_a0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                         ,0x447,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_b8,(Message *)local_c8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
              if (local_c8 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_c8 + 8))();
              }
            }
            if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a0,local_a0);
            }
            local_88.span_ = local_78.span_;
            local_88.index_ = local_78.index_;
            testing::internal::
            CmpHelperEQ<std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>,std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>>
                      ((internal *)local_c8,"it","first",
                       (reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                        *)&local_88,
                       (reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                        *)&local_78);
            if (local_c8[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_b8);
              if (local_c0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = anon_var_dwarf_d372b + 0x50;
              }
              else {
                pcVar9 = (local_c0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                         ,0x44a,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_a8,(Message *)&local_b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
              if ((long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) + 8))();
              }
            }
            if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c0,local_c0);
            }
            while( true ) {
              pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                        ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8,&local_58,0);
              pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                        ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_a8,
                         (span<int,__1L> *)local_c8,(index_type)local_c0);
              pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                        ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8,
                         local_88.span_,local_88.index_);
              pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                        (&local_b8,(span<int,__1L> *)CONCAT71(local_a8._1_7_,local_a8[0]),
                         (index_type)local_a0);
              tVar6.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ = local_b8.span_._4_4_;
              tVar6.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ = local_b8.span_._0_4_;
              if (((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )local_c8 ==
                   (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    )tVar6.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl) &&
                 (local_c0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_b8.index_)) break;
              ptVar8 = std::
                       reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>_>
                       ::operator*((reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                                    *)&local_88);
              *ptVar8 = 5;
              pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator--
                        (&local_88);
            }
            testing::internal::
            CmpHelperEQ<std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>,std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>>
                      ((internal *)local_c8,"it","beyond",
                       (reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                        *)&local_88,
                       (reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                        *)&local_98);
            if (local_c8[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_b8);
              if (local_c0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = anon_var_dwarf_d372b + 0x50;
              }
              else {
                pcVar9 = (local_c0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                         ,0x450,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_a8,(Message *)&local_b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
              if ((long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_) + 8))();
              }
            }
            if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c0,local_c0);
            }
            pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                      ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8,local_98.span_,
                       local_98.index_);
            pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                      (&local_b8,local_88.span_,local_88.index_);
            _Var7.
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = local_b8.span_._4_4_;
            _Var7.
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_4_ = local_b8.span_._0_4_;
            if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )local_c8 ==
                _Var7.
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl) {
              local_c8 = (undefined1  [8])((long)local_c0 - local_b8.index_);
              local_b8.span_._0_4_ = 0;
              testing::internal::CmpHelperEQ<long,int>
                        ((internal *)local_a8,"it - beyond","0",(long *)local_c8,(int *)&local_b8);
              if (local_a8[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_c8);
                if (local_a0 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar9 = anon_var_dwarf_d372b + 0x50;
                }
                else {
                  pcVar9 = (local_a0->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_b8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                           ,0x451,pcVar9);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_b8,(Message *)local_c8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
                if (local_c8 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_c8 + 8))();
                }
              }
              if (local_a0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_a0,local_a0);
              }
              pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                        ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8,&local_58,0);
              pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
                        (&local_b8,&local_58,local_58.storage_.super_extent_type<_1L>.size_);
              if ((local_c8 != (undefined1  [8])CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_))
                 || (local_c0 !=
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_b8.index_)) {
                do {
                  lhs = pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::
                        operator*((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8);
                  local_68.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._0_4_ = 5;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_a8,"n","5",lhs,(int *)&local_68);
                  if (local_a8[0] == (internal)0x0) {
                    testing::Message::Message(&local_68);
                    pcVar9 = anon_var_dwarf_d372b + 0x50;
                    if (local_a0 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar9 = (local_a0->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_60,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                               ,0x454,pcVar9);
                    testing::internal::AssertHelper::operator=(&local_60,&local_68);
                    testing::internal::AssertHelper::~AssertHelper(&local_60);
                    if ((long *)CONCAT44(local_68.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         local_68.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_4_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT44(local_68.ss_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_,
                                                  local_68.ss_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._0_4_) + 8))();
                    }
                  }
                  if (local_a0 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_a0,local_a0);
                  }
                  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::
                  operator++((span_iterator<pstore::gsl::span<int,__1L>,_false> *)local_c8);
                } while ((local_c8 !=
                          (undefined1  [8])CONCAT44(local_b8.span_._4_4_,local_b8.span_._0_4_)) ||
                        (local_c0 !=
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8.index_));
              }
              return;
            }
          }
        }
      }
    }
  }
  pstore::assert_failed
            ("span_ == rhs.span_",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
             ,0xa2);
}

Assistant:

TEST (GslSpan, RbeginRend) {
    {
        int a[] = {1, 2, 3, 4};
        span<int> s = make_span (a);

        auto it = s.rbegin ();
        auto first = it;
        EXPECT_EQ (it, first);
        EXPECT_EQ (*it, 4);

        auto beyond = s.rend ();
        EXPECT_NE (it, beyond);

        EXPECT_EQ (beyond - first, 4);
        EXPECT_EQ (first - first, 0);
        EXPECT_EQ (beyond - beyond, 0);

        ++it;
        EXPECT_EQ (it - first, 1);
        EXPECT_EQ (*it, 3);
        *it = 22;
        EXPECT_EQ (*it, 22);
        EXPECT_EQ (beyond - it, 3);

        it = first;
        EXPECT_EQ (it, first);
        while (it != s.rend ()) {
            *it = 5;
            ++it;
        }

        EXPECT_EQ (it, beyond);
        EXPECT_EQ (it - beyond, 0);

        for (auto & n : s) {
            EXPECT_EQ (n, 5);
        }
    }
}